

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O1

char * cmd_setenv(skynet_context *context,char *param)

{
  char cVar1;
  long lVar2;
  size_t sVar3;
  char *pcVar4;
  char *value;
  undefined8 uStack_20;
  char acStack_18 [8];
  
  uStack_20 = 0x114aca;
  sVar3 = strlen(param);
  lVar2 = -(sVar3 + 0x10 & 0xfffffffffffffff0);
  value = param + 1;
  pcVar4 = acStack_18 + lVar2;
  while( true ) {
    cVar1 = value[-1];
    if (cVar1 == '\0') {
      return (char *)0x0;
    }
    if (cVar1 == ' ') break;
    *pcVar4 = cVar1;
    value = value + 1;
    pcVar4 = pcVar4 + 1;
  }
  *pcVar4 = '\0';
  *(undefined8 *)((long)&uStack_20 + lVar2) = 0x114b03;
  skynet_setenv(acStack_18 + lVar2,value);
  return (char *)0x0;
}

Assistant:

static const char *
cmd_setenv(struct skynet_context * context, const char * param) {
	size_t sz = strlen(param);
	char key[sz+1];
	int i;
	for (i=0;param[i] != ' ' && param[i];i++) {
		key[i] = param[i];
	}
	if (param[i] == '\0')
		return NULL;

	key[i] = '\0';
	param += i+1;
	
	skynet_setenv(key,param);
	return NULL;
}